

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

unique_ptr<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>_>
 __thiscall spvtools::opt::analysis::MatrixConstant::CopyMatrixConstant(MatrixConstant *this)

{
  pointer pMVar1;
  pointer pMVar2;
  const_iterator __first;
  const_iterator __last;
  long in_RSI;
  __normal_iterator<const_spvtools::opt::analysis::Constant_**,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
  local_38;
  const_iterator local_30;
  Matrix *local_28;
  undefined1 local_19;
  MatrixConstant *this_local;
  unique_ptr<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>_>
  *another;
  
  local_19 = 0;
  this_local = this;
  local_28 = (Matrix *)(**(code **)(**(long **)(in_RSI + 8) + 0x80))();
  MakeUnique<spvtools::opt::analysis::MatrixConstant,spvtools::opt::analysis::Matrix_const*>
            ((spvtools *)this,&local_28);
  pMVar1 = std::
           unique_ptr<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>_>
           ::operator->((unique_ptr<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>_>
                         *)this);
  pMVar2 = std::
           unique_ptr<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>_>
           ::operator->((unique_ptr<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>_>
                         *)this);
  local_38._M_current =
       (Constant **)
       std::
       vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
       ::end(&(pMVar2->super_CompositeConstant).components_);
  __gnu_cxx::
  __normal_iterator<spvtools::opt::analysis::Constant_const*const*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>>
  ::__normal_iterator<spvtools::opt::analysis::Constant_const**>
            ((__normal_iterator<spvtools::opt::analysis::Constant_const*const*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>>
              *)&local_30,&local_38);
  __first = std::
            vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ::begin((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                     *)(in_RSI + 0x10));
  __last = std::
           vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           ::end((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  *)(in_RSI + 0x10));
  std::
  vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
  ::
  insert<__gnu_cxx::__normal_iterator<spvtools::opt::analysis::Constant_const*const*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>>,void>
            ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
              *)&(pMVar1->super_CompositeConstant).components_,local_30,
             (__normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
              )__first._M_current,
             (__normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
              )__last._M_current);
  return (__uniq_ptr_data<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<MatrixConstant> CopyMatrixConstant() const {
    auto another = MakeUnique<MatrixConstant>(type_->AsMatrix());
    another->components_.insert(another->components_.end(), components_.begin(),
                                components_.end());
    return another;
  }